

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void el::Loggers::reconfigureAllLoggers(Configurations *configurations)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var1 = (_Rb_tree_node_base *)(**(code **)(**(long **)(base::elStorage + 0x18) + 0x28))();
  while( true ) {
    p_Var2 = (_Rb_tree_node_base *)(**(code **)(**(long **)(base::elStorage + 0x18) + 0x30))();
    if (p_Var1 == p_Var2) break;
    if (*(Logger **)(p_Var1 + 2) != (Logger *)0x0) {
      Logger::configure(*(Logger **)(p_Var1 + 2),configurations);
    }
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return;
}

Assistant:

void Loggers::reconfigureAllLoggers(const Configurations& configurations) {
  for (base::RegisteredLoggers::iterator it = ELPP->registeredLoggers()->begin();
       it != ELPP->registeredLoggers()->end(); ++it) {
    Loggers::reconfigureLogger(it->second, configurations);
  }
}